

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool CheckSequenceLocksAtTip(CBlockIndex *tip,LockPoints *lock_points)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<int,_long> lockPair;
  CBlockIndex index;
  CBlockIndex local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xf4,"bool CheckSequenceLocksAtTip(CBlockIndex *, const LockPoints &)");
  }
  local_a8.phashBlock = (uint256 *)0x0;
  local_a8.nChainWork.super_base_uint<256U>.pn[6] = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[7] = 0;
  local_a8.nTx = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[2] = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[3] = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[4] = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[5] = 0;
  local_a8.nDataPos = 0;
  local_a8.nUndoPos = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[0] = 0;
  local_a8.nChainWork.super_base_uint<256U>.pn[1] = 0;
  local_a8.pskip = (CBlockIndex *)0x0;
  local_a8.m_chain_tx_count = 0;
  local_a8.nStatus = 0;
  local_a8.nVersion = 0;
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.nTime = 0;
  local_a8.nBits = 0;
  local_a8.nNonce = 0;
  local_a8.nSequenceId = 0;
  local_a8.nTimeMax = 0;
  local_a8.nFile = 0;
  local_a8.nHeight = tip->nHeight + 1;
  lockPair._4_4_ = 0;
  lockPair.first = lock_points->height;
  lockPair.second = lock_points->time;
  local_a8.pprev = tip;
  bVar1 = EvaluateSequenceLocks(&local_a8,lockPair);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSequenceLocksAtTip(CBlockIndex* tip,
                             const LockPoints& lock_points)
{
    assert(tip != nullptr);

    CBlockIndex index;
    index.pprev = tip;
    // CheckSequenceLocksAtTip() uses active_chainstate.m_chain.Height()+1 to evaluate
    // height based locks because when SequenceLocks() is called within
    // ConnectBlock(), the height of the block *being*
    // evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    index.nHeight = tip->nHeight + 1;

    return EvaluateSequenceLocks(index, {lock_points.height, lock_points.time});
}